

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  FILE *__stream;
  size_t sVar5;
  long lVar6;
  long lVar7;
  wasm_table_t *table;
  wasm_func_t *func;
  wasm_func_t *pwVar8;
  wasm_func_t *pwVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  char *__s;
  wasm_byte_vec_t binary;
  wasm_extern_vec_t exports;
  wasm_limits_t limits;
  wasm_valtype_t *rs [1];
  wasm_valtype_t *ps [1];
  wasm_extern_vec_t imports;
  wasm_valtype_vec_t results;
  undefined1 local_98 [8];
  void *local_90;
  wasm_extern_vec_t local_88;
  undefined8 local_78 [2];
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_40 [16];
  
  puts("Initializing...");
  uVar3 = wasm_engine_new();
  uVar4 = wasm_store_new(uVar3);
  puts("Loading binary...");
  __stream = fopen("table.wasm","rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    sVar5 = ftell(__stream);
    fseek(__stream,0,0);
    wasm_byte_vec_new_uninitialized(local_98,sVar5);
    sVar5 = fread(local_90,sVar5,1,__stream);
    if (sVar5 == 1) {
      fclose(__stream);
      puts("Compiling module...");
      lVar6 = wasm_module_new(uVar4,local_98);
      if (lVar6 == 0) {
        __s = "> Error compiling module!";
      }
      else {
        wasm_byte_vec_delete(local_98);
        puts("Instantiating module...");
        local_58 = 0;
        uStack_50 = 0;
        lVar7 = wasm_instance_new(uVar4,lVar6,&local_58,0);
        if (lVar7 != 0) {
          puts("Extracting exports...");
          wasm_instance_exports(lVar7);
          table = get_export_table(&local_88,0);
          func = get_export_func(&local_88,1);
          pwVar8 = get_export_func(&local_88,2);
          pwVar9 = get_export_func(&local_88,3);
          wasm_module_delete(lVar6);
          puts("Creating callback...");
          uVar10 = wasm_valtype_new(0);
          local_68 = wasm_valtype_new(0);
          local_60 = uVar10;
          wasm_valtype_vec_new(local_78,1);
          wasm_valtype_vec_new(local_40,1,&local_68);
          uVar10 = wasm_functype_new(local_78,local_40);
          uVar11 = wasm_func_new(uVar4,uVar10,neg_callback);
          wasm_functype_delete(uVar10);
          uVar10 = wasm_table_copy(table);
          cVar1 = wasm_table_same(table);
          if (cVar1 == '\0') {
            __assert_fail("wasm_table_same(table, copy)",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/third_party/wasm-c-api/example/table.c"
                          ,0x8d,"int main(int, const char **)");
          }
          wasm_table_delete(uVar10);
          puts("Checking table...");
          iVar2 = wasm_table_size(table);
          if (iVar2 == 2) {
            check_table(table,0,false);
            check_table(table,1,true);
            check_trap(func,0,0);
            check_call(func,7,1,7);
            check_trap(func,0,2);
            puts("Mutating table...");
            uVar10 = wasm_func_as_ref(pwVar9);
            cVar1 = wasm_table_set(table,0,uVar10);
            if ((cVar1 != '\0') && (cVar1 = wasm_table_set(table,1,0), cVar1 != '\0')) {
              uVar10 = wasm_func_as_ref(pwVar8);
              cVar1 = wasm_table_set(table,2,uVar10);
              if (cVar1 == '\0') {
                check_table(table,0,true);
                check_table(table,1,false);
                check_call(func,7,0,0x29a);
                check_trap(func,0,1);
                check_trap(func,0,2);
                puts("Growing table...");
                cVar1 = wasm_table_grow(table,3,0);
                if ((cVar1 != '\0') && (iVar2 = wasm_table_size(table), iVar2 == 5)) {
                  uVar10 = wasm_func_as_ref(pwVar8);
                  cVar1 = wasm_table_set(table,2,uVar10);
                  if (cVar1 != '\0') {
                    uVar10 = wasm_func_as_ref(uVar11);
                    cVar1 = wasm_table_set(table,3,uVar10);
                    if ((cVar1 != '\0') && (cVar1 = wasm_table_set(table,5,0), cVar1 == '\0')) {
                      check_table(table,2,true);
                      check_table(table,3,true);
                      check_table(table,4,false);
                      check_call(func,5,2,5);
                      check_call(func,6,3,-6);
                      check_trap(func,0,4);
                      check_trap(func,0,5);
                      uVar10 = wasm_func_as_ref(pwVar8);
                      cVar1 = wasm_table_grow(table,2,uVar10);
                      if ((cVar1 != '\0') && (iVar2 = wasm_table_size(table), iVar2 == 7)) {
                        check_table(table,5,true);
                        check_table(table,6,true);
                        cVar1 = wasm_table_grow(table,5,0);
                        if (((cVar1 == '\0') && (cVar1 = wasm_table_grow(table,3,0), cVar1 != '\0'))
                           && (cVar1 = wasm_table_grow(table,0,0), cVar1 != '\0')) {
                          wasm_func_delete(uVar11);
                          wasm_extern_vec_delete(&local_88);
                          wasm_instance_delete(lVar7);
                          puts("Creating stand-alone table...");
                          local_78[0] = 0x500000005;
                          uVar10 = wasm_valtype_new(0x81);
                          uVar10 = wasm_tabletype_new(uVar10,local_78);
                          uVar11 = wasm_table_new(uVar4,uVar10,0);
                          iVar2 = wasm_table_size(uVar11);
                          if (((iVar2 == 5) && (cVar1 = wasm_table_grow(uVar11,1,0), cVar1 == '\0'))
                             && (cVar1 = wasm_table_grow(uVar11,0,0), cVar1 != '\0')) {
                            wasm_tabletype_delete(uVar10);
                            wasm_table_delete(uVar11);
                            puts("Shutting down...");
                            wasm_store_delete(uVar4);
                            wasm_engine_delete(uVar3);
                            puts("Done.");
                            return 0;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          puts("> Error, expected success");
          exit(1);
        }
        __s = "> Error instantiating module!";
      }
      goto LAB_00102bc2;
    }
  }
  __s = "> Error loading module!";
LAB_00102bc2:
  puts(__s);
  return 1;
}

Assistant:

int main(int argc, const char* argv[]) {
  // Initialize.
  printf("Initializing...\n");
  wasm_engine_t* engine = wasm_engine_new();
  wasm_store_t* store = wasm_store_new(engine);

  // Load binary.
  printf("Loading binary...\n");
  FILE* file = fopen("table.wasm", "rb");
  if (!file) {
    printf("> Error loading module!\n");
    return 1;
  }
  fseek(file, 0L, SEEK_END);
  size_t file_size = ftell(file);
  fseek(file, 0L, SEEK_SET);
  wasm_byte_vec_t binary;
  wasm_byte_vec_new_uninitialized(&binary, file_size);
  if (fread(binary.data, file_size, 1, file) != 1) {
    printf("> Error loading module!\n");
    return 1;
  }
  fclose(file);

  // Compile.
  printf("Compiling module...\n");
  own wasm_module_t* module = wasm_module_new(store, &binary);
  if (!module) {
    printf("> Error compiling module!\n");
    return 1;
  }

  wasm_byte_vec_delete(&binary);

  // Instantiate.
  printf("Instantiating module...\n");
  wasm_extern_vec_t imports = WASM_EMPTY_VEC;
  own wasm_instance_t* instance =
    wasm_instance_new(store, module, &imports, NULL);
  if (!instance) {
    printf("> Error instantiating module!\n");
    return 1;
  }

  // Extract export.
  printf("Extracting exports...\n");
  own wasm_extern_vec_t exports;
  wasm_instance_exports(instance, &exports);
  size_t i = 0;
  wasm_table_t* table = get_export_table(&exports, i++);
  wasm_func_t* call_indirect = get_export_func(&exports, i++);
  wasm_func_t* f = get_export_func(&exports, i++);
  wasm_func_t* g = get_export_func(&exports, i++);

  wasm_module_delete(module);

  // Create external function.
  printf("Creating callback...\n");
  own wasm_functype_t* neg_type = wasm_functype_new_1_1(wasm_valtype_new_i32(), wasm_valtype_new_i32());
  own wasm_func_t* h = wasm_func_new(store, neg_type, neg_callback);

  wasm_functype_delete(neg_type);

  // Try cloning.
  own wasm_table_t* copy = wasm_table_copy(table);
  assert(wasm_table_same(table, copy));
  wasm_table_delete(copy);

  // Check initial table.
  printf("Checking table...\n");
  check(wasm_table_size(table) == 2);
  check_table(table, 0, false);
  check_table(table, 1, true);
  check_trap(call_indirect, 0, 0);
  check_call(call_indirect, 7, 1, 7);
  check_trap(call_indirect, 0, 2);

  // Mutate table.
  printf("Mutating table...\n");
  check(wasm_table_set(table, 0, wasm_func_as_ref(g)));
  check(wasm_table_set(table, 1, NULL));
  check(! wasm_table_set(table, 2, wasm_func_as_ref(f)));
  check_table(table, 0, true);
  check_table(table, 1, false);
  check_call(call_indirect, 7, 0, 666);
  check_trap(call_indirect, 0, 1);
  check_trap(call_indirect, 0, 2);

  // Grow table.
  printf("Growing table...\n");
  check(wasm_table_grow(table, 3, NULL));
  check(wasm_table_size(table) == 5);
  check(wasm_table_set(table, 2, wasm_func_as_ref(f)));
  check(wasm_table_set(table, 3, wasm_func_as_ref(h)));
  check(! wasm_table_set(table, 5, NULL));
  check_table(table, 2, true);
  check_table(table, 3, true);
  check_table(table, 4, false);
  check_call(call_indirect, 5, 2, 5);
  check_call(call_indirect, 6, 3, -6);
  check_trap(call_indirect, 0, 4);
  check_trap(call_indirect, 0, 5);

  check(wasm_table_grow(table, 2, wasm_func_as_ref(f)));
  check(wasm_table_size(table) == 7);
  check_table(table, 5, true);
  check_table(table, 6, true);

  check(! wasm_table_grow(table, 5, NULL));
  check(wasm_table_grow(table, 3, NULL));
  check(wasm_table_grow(table, 0, NULL));

  wasm_func_delete(h);
  wasm_extern_vec_delete(&exports);
  wasm_instance_delete(instance);

  // Create stand-alone table.
  // TODO(wasm+): Once Wasm allows multiple tables, turn this into import.
  printf("Creating stand-alone table...\n");
  wasm_limits_t limits = {5, 5};
  own wasm_tabletype_t* tabletype =
    wasm_tabletype_new(wasm_valtype_new(WASM_FUNCREF), &limits);
  own wasm_table_t* table2 = wasm_table_new(store, tabletype, NULL);
  check(wasm_table_size(table2) == 5);
  check(! wasm_table_grow(table2, 1, NULL));
  check(wasm_table_grow(table2, 0, NULL));

  wasm_tabletype_delete(tabletype);
  wasm_table_delete(table2);

  // Shut down.
  printf("Shutting down...\n");
  wasm_store_delete(store);
  wasm_engine_delete(engine);

  // All done.
  printf("Done.\n");
  return 0;
}